

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libretro_main.c
# Opt level: O0

void retro_deinit(void)

{
  if (core_initialized) {
    free(out_framebuffer);
    gb_emu_deinit(&gb_emu);
    core_initialized = false;
  }
  return;
}

Assistant:

void retro_deinit()
{
   if (!core_initialized)
      return;

   free(out_framebuffer);
   gb_emu_deinit(&gb_emu);

   core_initialized = false;
   return;
}